

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_ALSADriver.cpp
# Opt level: O0

void ALSAMidiDriver::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  int *result;
  ALSAMidiDriver *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      mainWindowTitleContributionUpdated((ALSAMidiDriver *)_o,(QString *)_a[1]);
    }
  }
  else if ((_c == IndexOfMethod) &&
          (pcVar1 = *_a[1],
          pcVar1 == mainWindowTitleContributionUpdated &&
          (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0))) {
    *(undefined4 *)*_a = 0;
  }
  return;
}

Assistant:

void ALSAMidiDriver::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ALSAMidiDriver *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->mainWindowTitleContributionUpdated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (ALSAMidiDriver::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&ALSAMidiDriver::mainWindowTitleContributionUpdated)) {
                *result = 0;
                return;
            }
        }
    }
}